

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_impl.cpp
# Opt level: O1

MPP_RET mpp_enc_proc_rc_cfg(MppCodingType coding,MppEncRcCfg *dst,MppEncRcCfg *src)

{
  undefined8 uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  RK_U32 RVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  MppEncRcCfg *pMVar17;
  undefined8 *puVar18;
  RK_S32 *pRVar19;
  RK_S32 *pRVar20;
  uint uVar21;
  uint uVar22;
  MPP_RET MVar23;
  byte bVar24;
  RK_S32 local_fc [19];
  undefined8 local_b0 [15];
  RK_S32 local_38;
  
  bVar24 = 0;
  uVar2 = src->change;
  if (uVar2 == 0) {
    MVar23 = MPP_OK;
  }
  else {
    pMVar17 = dst;
    puVar18 = local_b0;
    for (lVar16 = 0xf; lVar16 != 0; lVar16 = lVar16 + -1) {
      *puVar18 = *(undefined8 *)pMVar17;
      pMVar17 = (MppEncRcCfg *)&pMVar17->quality;
      puVar18 = puVar18 + 1;
    }
    local_38 = dst->init_ip_ratio;
    uVar3 = dst->qp_init;
    uVar4 = dst->qp_max;
    uVar5 = dst->qp_max_i;
    uVar6 = dst->qp_min;
    uVar7 = dst->qp_min_i;
    uVar8 = dst->qp_max_step;
    uVar9 = dst->qp_delta_ip;
    uVar10 = dst->qp_delta_vi;
    pRVar19 = &dst->fqp_min_i;
    pRVar20 = local_fc;
    for (lVar16 = 0x13; lVar16 != 0; lVar16 = lVar16 + -1) {
      *pRVar20 = *pRVar19;
      pRVar19 = pRVar19 + 1;
      pRVar20 = pRVar20 + 1;
    }
    if ((uVar2 & 1) != 0) {
      dst->rc_mode = src->rc_mode;
    }
    if ((uVar2 & 2) != 0) {
      dst->quality = src->quality;
    }
    if ((uVar2 & 4) != 0) {
      dst->bps_target = src->bps_target;
      dst->bps_max = src->bps_max;
      dst->bps_min = src->bps_min;
    }
    if ((uVar2 & 0x20) != 0) {
      dst->fps_in_flex = src->fps_in_flex;
      dst->fps_in_num = src->fps_in_num;
      dst->fps_in_denom = src->fps_in_denom;
    }
    if ((uVar2 & 0x40) != 0) {
      dst->fps_out_flex = src->fps_out_flex;
      dst->fps_out_num = src->fps_out_num;
      dst->fps_out_denom = src->fps_out_denom;
      dst->fps_chg_no_idr = src->fps_chg_no_idr;
    }
    if ((char)uVar2 < '\0') {
      iVar11 = src->gop;
      if ((dst->gop < iVar11) && (dst->refresh_en != 0)) {
        dst->refresh_en = 0;
      }
      dst->gop = iVar11;
    }
    if ((uVar2 >> 0x1c & 1) != 0) {
      dst->ref_cfg = src->ref_cfg;
    }
    if ((uVar2 >> 9 & 1) != 0) {
      dst->max_reenc_times = src->max_reenc_times;
    }
    if ((uVar2 >> 10 & 1) != 0) {
      dst->drop_mode = src->drop_mode;
      dst->drop_threshold = src->drop_threshold;
      dst->drop_gap = src->drop_gap;
    }
    MVar23 = MPP_OK;
    if ((uVar2 >> 0xe & 1) != 0) {
      MVar23 = MPP_OK;
      if (1 < (int)src->rc_priority) {
        _mpp_log_l(2,"mpp_enc","invalid rc_priority %d should be[%d, %d] \n",(char *)0x0,
                   (ulong)src->rc_priority,0,2);
        MVar23 = MPP_ERR_VALUE;
      }
      dst->rc_priority = src->rc_priority;
    }
    if ((short)uVar2 < 0) {
      if (2 < (int)src->super_mode) {
        _mpp_log_l(2,"mpp_enc","invalid super_mode %d should be[%d, %d] \n",(char *)0x0,
                   (ulong)src->super_mode,0,3);
        MVar23 = MPP_ERR_VALUE;
      }
      dst->super_mode = src->super_mode;
      dst->super_i_thd = src->super_i_thd;
      dst->super_p_thd = src->super_p_thd;
    }
    if ((uVar2 >> 0x18 & 1) != 0) {
      RVar12 = src->debreath_en;
      dst->debreath_en = RVar12;
      uVar21 = src->debre_strength;
      dst->debre_strength = uVar21;
      if (0x23 < uVar21 && RVar12 != 0) {
        _mpp_log_l(2,"mpp_enc","invalid debre_strength should be[%d, %d] \n",(char *)0x0,0,0x23);
        MVar23 = MPP_ERR_VALUE;
      }
    }
    if ((uVar2 >> 0xb & 1) != 0) {
      dst->max_i_prop = src->max_i_prop;
    }
    if ((uVar2 >> 0xc & 1) != 0) {
      dst->min_i_prop = src->min_i_prop;
    }
    if ((uVar2 >> 0xd & 1) != 0) {
      dst->init_ip_ratio = src->init_ip_ratio;
    }
    if ((uVar2 >> 0x10 & 1) != 0) {
      dst->qp_init = src->qp_init;
    }
    if ((uVar2 >> 0x11 & 1) != 0) {
      dst->qp_min = src->qp_min;
      dst->qp_max = src->qp_max;
    }
    if ((uVar2 >> 0x12 & 1) != 0) {
      dst->qp_min_i = src->qp_min_i;
      dst->qp_max_i = src->qp_max_i;
    }
    if ((uVar2 >> 0x13 & 1) != 0) {
      dst->qp_max_step = src->qp_max_step;
    }
    if ((uVar2 >> 0x14 & 1) != 0) {
      dst->qp_delta_ip = src->qp_delta_ip;
    }
    if ((uVar2 >> 0x15 & 1) != 0) {
      dst->qp_delta_vi = src->qp_delta_vi;
    }
    if ((uVar2 >> 0x1d & 1) != 0) {
      dst->fqp_min_i = src->fqp_min_i;
      dst->fqp_min_p = src->fqp_min_p;
      dst->fqp_max_i = src->fqp_max_i;
      dst->fqp_max_p = src->fqp_max_p;
    }
    if ((uVar2 >> 0x19 & 1) != 0) {
      dst->hier_qp_en = src->hier_qp_en;
      uVar1 = *(undefined8 *)(src->hier_qp_delta + 2);
      *(undefined8 *)dst->hier_qp_delta = *(undefined8 *)src->hier_qp_delta;
      *(undefined8 *)(dst->hier_qp_delta + 2) = uVar1;
      uVar1 = *(undefined8 *)(src->hier_frame_num + 2);
      *(undefined8 *)dst->hier_frame_num = *(undefined8 *)src->hier_frame_num;
      *(undefined8 *)(dst->hier_frame_num + 2) = uVar1;
    }
    if ((uVar2 >> 0x1a & 1) != 0) {
      dst->stats_time = src->stats_time;
    }
    if ((uVar2 >> 0x1b & 1) != 0) {
      if (dst->debreath_en != 0) {
        _mpp_log_l(2,"mpp_enc","Turn off Debreath first.","mpp_enc_proc_rc_cfg");
        MVar23 = MPP_ERR_VALUE;
      }
      dst->refresh_en = src->refresh_en;
      dst->refresh_mode = src->refresh_mode;
      dst->refresh_num = src->refresh_num;
    }
    if (4 < (int)dst->rc_mode) {
      _mpp_log_l(2,"mpp_enc","invalid rc mode %d should be RC_MODE_VBR or RC_MODE_CBR\n",(char *)0x0
                 ,(ulong)src->rc_mode);
      MVar23 = MPP_ERR_VALUE;
    }
    if (6 < (int)dst->quality) {
      _mpp_log_l(2,"mpp_enc","invalid quality %d should be from QUALITY_WORST to QUALITY_BEST\n",
                 (char *)0x0);
      MVar23 = MPP_ERR_VALUE;
    }
    if (dst->rc_mode != MPP_ENC_RC_MODE_FIXQP) {
      uVar21 = 0x400;
      if (coding == MPP_VIDEO_CodingMJPEG) {
        uVar21 = 0x1000;
      }
      uVar22 = 0xc800000;
      if (coding == MPP_VIDEO_CodingMJPEG) {
        uVar22 = 0x32000000;
      }
      uVar13 = dst->bps_target;
      if ((((int)uVar13 <= (int)uVar21 || (int)uVar22 <= (int)uVar13) ||
          (dst->bps_max <= (int)uVar21 || (int)uVar22 <= dst->bps_max)) ||
         ((int)uVar22 <= dst->bps_min || dst->bps_min <= (int)uVar21)) {
        _mpp_log_l(2,"mpp_enc",
                   "invalid bit per second %x:%u min %x:%u max %x:%u out of range %dK~%dM\n",
                   (char *)0x0,(ulong)uVar13,(ulong)uVar13,(ulong)(uint)dst->bps_min,
                   (ulong)(uint)dst->bps_min,(ulong)(uint)dst->bps_max,(ulong)(uint)dst->bps_max,
                   (ulong)(uVar21 >> 10),(ulong)(uVar22 >> 0x14));
        MVar23 = MPP_ERR_VALUE;
      }
    }
    if (((dst->fps_in_num < 0) || (dst->fps_in_denom < 0)) ||
       ((dst->fps_out_num < 0 || (dst->fps_out_denom < 0)))) {
      _mpp_log_l(2,"mpp_enc","invalid fps cfg [number:denom:flex]: in [%d:%d:%d] out [%d:%d:%d]\n",
                 (char *)0x0,(ulong)(uint)dst->fps_in_num,(ulong)(uint)dst->fps_in_denom,
                 (ulong)(uint)dst->fps_in_flex,(ulong)(uint)dst->fps_out_num,
                 (ulong)(uint)dst->fps_out_denom,(ulong)(uint)dst->fps_out_flex);
      MVar23 = MPP_ERR_VALUE;
    }
    if (dst->qp_min_i < 1) {
      dst->qp_min_i = dst->qp_min;
    }
    if (dst->qp_max_i < 1) {
      dst->qp_max_i = dst->qp_max;
    }
    uVar21 = dst->qp_min;
    if ((((int)uVar21 < 0) || (dst->qp_max < (int)uVar21 || dst->qp_max < 0)) ||
       (((iVar11 = dst->qp_min_i, iVar11 < 0 ||
         (iVar14 = dst->qp_max_i, iVar14 < iVar11 || iVar14 < 0)) ||
        ((iVar15 = dst->qp_init, 0 < iVar15 && (iVar14 < iVar15 || iVar15 < iVar11)))))) {
      _mpp_log_l(2,"mpp_enc","invalid qp range: init %d i [%d:%d] p [%d:%d]\n",(char *)0x0,
                 (ulong)(uint)dst->qp_init,(ulong)(uint)dst->qp_min_i,(ulong)(uint)dst->qp_max_i,
                 (ulong)uVar21,(ulong)(uint)dst->qp_max);
      dst->qp_init = uVar3;
      dst->qp_min_i = uVar7;
      dst->qp_max_i = uVar5;
      dst->qp_min = uVar6;
      dst->qp_max = uVar4;
      _mpp_log_l(2,"mpp_enc","restore qp range: init %d i [%d:%d] p [%d:%d]\n",(char *)0x0,
                 (ulong)uVar3,(ulong)uVar7,(ulong)uVar5,(ulong)uVar6,(ulong)uVar4);
    }
    uVar21 = dst->qp_delta_ip;
    uVar22 = -uVar21;
    if (0 < (int)uVar21) {
      uVar22 = uVar21;
    }
    if (8 < uVar22) {
      _mpp_log_l(2,"mpp_enc","invalid qp delta ip %d restore to %d\n",(char *)0x0,(ulong)uVar21,
                 (ulong)uVar9);
      dst->qp_delta_ip = uVar9;
    }
    uVar21 = dst->qp_delta_vi;
    uVar22 = -uVar21;
    if (0 < (int)uVar21) {
      uVar22 = uVar21;
    }
    if (6 < uVar22) {
      _mpp_log_l(2,"mpp_enc","invalid qp delta vi %d restore to %d\n",(char *)0x0,(ulong)uVar21,
                 (ulong)uVar10);
      dst->qp_delta_vi = uVar10;
    }
    if (dst->qp_max_step < 0) {
      _mpp_log_l(2,"mpp_enc","invalid qp max step %d restore to %d\n",(char *)0x0,
                 (ulong)(uint)dst->qp_max_step,(ulong)uVar8);
      dst->qp_max_step = uVar8;
    }
    if (0x3c < dst->stats_time) {
      _mpp_log_l(2,"mpp_enc","warning: bitrate statistic time %d is larger than 60s\n",(char *)0x0);
    }
    dst->change = dst->change | uVar2;
    if (MVar23 == MPP_OK) {
      _mpp_log_l(4,"mpp_enc","MPP_ENC_SET_RC_CFG bps %d [%d : %d] fps [%d:%d] gop %d\n",(char *)0x0,
                 (ulong)(uint)dst->bps_target,(ulong)(uint)dst->bps_min,(ulong)(uint)dst->bps_max,
                 (ulong)(uint)dst->fps_in_num,(ulong)(uint)dst->fps_out_num,(ulong)(uint)dst->gop);
    }
    else {
      _mpp_log_l(2,"mpp_enc","failed to accept new rc config\n","mpp_enc_proc_rc_cfg");
      puVar18 = local_b0;
      pMVar17 = dst;
      for (lVar16 = 0xf; lVar16 != 0; lVar16 = lVar16 + -1) {
        uVar1 = *puVar18;
        pMVar17->change = (int)uVar1;
        pMVar17->rc_mode = (int)((ulong)uVar1 >> 0x20);
        puVar18 = puVar18 + (ulong)bVar24 * -2 + 1;
        pMVar17 = (MppEncRcCfg *)((long)pMVar17 + (ulong)bVar24 * -0x10 + 8);
      }
      dst->init_ip_ratio = local_38;
      dst->qp_init = uVar3;
      dst->qp_max = uVar4;
      dst->qp_max_i = uVar5;
      dst->qp_min = uVar6;
      dst->qp_min_i = uVar7;
      dst->qp_max_step = uVar8;
      dst->qp_delta_ip = uVar9;
      dst->qp_delta_vi = uVar10;
      pRVar19 = local_fc;
      pRVar20 = &dst->fqp_min_i;
      for (lVar16 = 0x13; lVar16 != 0; lVar16 = lVar16 + -1) {
        *pRVar20 = *pRVar19;
        pRVar19 = pRVar19 + (ulong)bVar24 * -2 + 1;
        pRVar20 = pRVar20 + (ulong)bVar24 * -2 + 1;
      }
    }
  }
  return MVar23;
}

Assistant:

MPP_RET mpp_enc_proc_rc_cfg(MppCodingType coding, MppEncRcCfg *dst, MppEncRcCfg *src)
{
    MPP_RET ret = MPP_OK;
    RK_U32 change = src->change;

    if (change) {
        MppEncRcCfg bak = *dst;

        if (change & MPP_ENC_RC_CFG_CHANGE_RC_MODE)
            dst->rc_mode = src->rc_mode;

        if (change & MPP_ENC_RC_CFG_CHANGE_QUALITY)
            dst->quality = src->quality;

        if (change & MPP_ENC_RC_CFG_CHANGE_BPS) {
            dst->bps_target = src->bps_target;
            dst->bps_max = src->bps_max;
            dst->bps_min = src->bps_min;
        }

        if (change & MPP_ENC_RC_CFG_CHANGE_FPS_IN) {
            dst->fps_in_flex = src->fps_in_flex;
            dst->fps_in_num = src->fps_in_num;
            dst->fps_in_denom = src->fps_in_denom;
        }

        if (change & MPP_ENC_RC_CFG_CHANGE_FPS_OUT) {
            dst->fps_out_flex = src->fps_out_flex;
            dst->fps_out_num = src->fps_out_num;
            dst->fps_out_denom = src->fps_out_denom;
            dst->fps_chg_no_idr = src->fps_chg_no_idr;
        }

        if (change & MPP_ENC_RC_CFG_CHANGE_GOP) {
            /*
             * If GOP is changed smaller, disable Intra-Refresh
             * and User level should reconfig Intra-Refresh
             */
            if (dst->gop < src->gop && dst->refresh_en) {
                dst->refresh_en = 0;
            }
            dst->gop = src->gop;
        }

        if (change & MPP_ENC_RC_CFG_CHANGE_GOP_REF_CFG)
            dst->ref_cfg = src->ref_cfg;

        if (change & MPP_ENC_RC_CFG_CHANGE_MAX_REENC)
            dst->max_reenc_times = src->max_reenc_times;

        if (change & MPP_ENC_RC_CFG_CHANGE_DROP_FRM) {
            dst->drop_mode = src->drop_mode;
            dst->drop_threshold = src->drop_threshold;
            dst->drop_gap = src->drop_gap;
        }

        if (change & MPP_ENC_RC_CFG_CHANGE_PRIORITY) {
            if (src->rc_priority >= MPP_ENC_RC_PRIORITY_BUTT) {
                mpp_err("invalid rc_priority %d should be[%d, %d] \n",
                        src->rc_priority, MPP_ENC_RC_BY_BITRATE_FIRST, MPP_ENC_RC_PRIORITY_BUTT);
                ret = MPP_ERR_VALUE;
            }
            dst->rc_priority = src->rc_priority;
        }

        if (change & MPP_ENC_RC_CFG_CHANGE_SUPER_FRM) {
            if (src->super_mode >= MPP_ENC_RC_SUPER_FRM_BUTT) {
                mpp_err("invalid super_mode %d should be[%d, %d] \n",
                        src->super_mode, MPP_ENC_RC_SUPER_FRM_NONE, MPP_ENC_RC_SUPER_FRM_BUTT);
                ret = MPP_ERR_VALUE;
            }
            dst->super_mode = src->super_mode;
            dst->super_i_thd = src->super_i_thd;
            dst->super_p_thd = src->super_p_thd;
        }

        if (change & MPP_ENC_RC_CFG_CHANGE_DEBREATH) {
            dst->debreath_en    = src->debreath_en;
            dst->debre_strength = src->debre_strength;
            if (dst->debreath_en && dst->debre_strength > 35) {
                mpp_err("invalid debre_strength should be[%d, %d] \n", 0, 35);
                ret = MPP_ERR_VALUE;
            }
        }

        if (change & MPP_ENC_RC_CFG_CHANGE_MAX_I_PROP)
            dst->max_i_prop = src->max_i_prop;

        if (change & MPP_ENC_RC_CFG_CHANGE_MIN_I_PROP)
            dst->min_i_prop = src->min_i_prop;

        if (change & MPP_ENC_RC_CFG_CHANGE_INIT_IP_RATIO)
            dst->init_ip_ratio = src->init_ip_ratio;

        if (change & MPP_ENC_RC_CFG_CHANGE_QP_INIT)
            dst->qp_init = src->qp_init;

        if (change & MPP_ENC_RC_CFG_CHANGE_QP_RANGE) {
            dst->qp_min = src->qp_min;
            dst->qp_max = src->qp_max;
        }

        if (change & MPP_ENC_RC_CFG_CHANGE_QP_RANGE_I) {
            dst->qp_min_i = src->qp_min_i;
            dst->qp_max_i = src->qp_max_i;
        }

        if (change & MPP_ENC_RC_CFG_CHANGE_QP_MAX_STEP)
            dst->qp_max_step = src->qp_max_step;

        if (change & MPP_ENC_RC_CFG_CHANGE_QP_IP)
            dst->qp_delta_ip = src->qp_delta_ip;

        if (change & MPP_ENC_RC_CFG_CHANGE_QP_VI)
            dst->qp_delta_vi = src->qp_delta_vi;

        if (change & MPP_ENC_RC_CFG_CHANGE_FQP) {
            dst->fqp_min_i = src->fqp_min_i;
            dst->fqp_min_p = src->fqp_min_p;
            dst->fqp_max_i = src->fqp_max_i;
            dst->fqp_max_p = src->fqp_max_p;
        }

        if (change & MPP_ENC_RC_CFG_CHANGE_HIER_QP) {
            dst->hier_qp_en = src->hier_qp_en;
            memcpy(dst->hier_qp_delta, src->hier_qp_delta, sizeof(src->hier_qp_delta));
            memcpy(dst->hier_frame_num, src->hier_frame_num, sizeof(src->hier_frame_num));
        }

        if (change & MPP_ENC_RC_CFG_CHANGE_ST_TIME)
            dst->stats_time = src->stats_time;

        if (change & MPP_ENC_RC_CFG_CHANGE_REFRESH) {
            if (dst->debreath_en) {
                mpp_err_f("Turn off Debreath first.");
                ret = MPP_ERR_VALUE;
            }
            dst->refresh_en = src->refresh_en;
            dst->refresh_mode = src->refresh_mode;
            // Make sure refresh_num is legal
            dst->refresh_num = src->refresh_num;
        }

        // parameter checking
        if (dst->rc_mode >= MPP_ENC_RC_MODE_BUTT) {
            mpp_err("invalid rc mode %d should be RC_MODE_VBR or RC_MODE_CBR\n",
                    src->rc_mode);
            ret = MPP_ERR_VALUE;
        }
        if (dst->quality >= MPP_ENC_RC_QUALITY_BUTT) {
            mpp_err("invalid quality %d should be from QUALITY_WORST to QUALITY_BEST\n",
                    dst->quality);
            ret = MPP_ERR_VALUE;
        }

        if (dst->rc_mode != MPP_ENC_RC_MODE_FIXQP) {
            RK_S32 bps_min = MPP_ENC_MIN_BPS;
            RK_S32 bps_max = MPP_ENC_MAX_BPS;

            if (coding == MPP_VIDEO_CodingMJPEG) {
                bps_min *= 4;
                bps_max *= 4;
                if (bps_max < 0)
                    bps_max = INT_MAX;
            }

            if ((dst->bps_target >= bps_max || dst->bps_target <= bps_min) ||
                (dst->bps_max    >= bps_max || dst->bps_max    <= bps_min) ||
                (dst->bps_min    >= bps_max || dst->bps_min    <= bps_min)) {
                mpp_err("invalid bit per second %x:%u min %x:%u max %x:%u out of range %dK~%dM\n",
                        dst->bps_target, dst->bps_target, dst->bps_min,
                        dst->bps_min, dst->bps_max, dst->bps_max,
                        bps_min / SZ_1K,  bps_max / SZ_1M);
                ret = MPP_ERR_VALUE;
            }
        }

        if (dst->fps_in_num < 0 || dst->fps_in_denom < 0 ||
            dst->fps_out_num < 0 || dst->fps_out_denom < 0) {
            mpp_err("invalid fps cfg [number:denom:flex]: in [%d:%d:%d] out [%d:%d:%d]\n",
                    dst->fps_in_num, dst->fps_in_denom, dst->fps_in_flex,
                    dst->fps_out_num, dst->fps_out_denom, dst->fps_out_flex);
            ret = MPP_ERR_VALUE;
        }

        // if I frame min/max is not set use normal case
        if (dst->qp_min_i <= 0)
            dst->qp_min_i = dst->qp_min;
        if (dst->qp_max_i <= 0)
            dst->qp_max_i = dst->qp_max;
        if (dst->qp_min < 0 || dst->qp_max < 0 || dst->qp_min > dst->qp_max ||
            dst->qp_min_i < 0 || dst->qp_max_i < 0 ||
            dst->qp_min_i > dst->qp_max_i ||
            (dst->qp_init > 0 &&
             (dst->qp_init > dst->qp_max_i || dst->qp_init < dst->qp_min_i))) {
            mpp_err("invalid qp range: init %d i [%d:%d] p [%d:%d]\n",
                    dst->qp_init, dst->qp_min_i, dst->qp_max_i,
                    dst->qp_min, dst->qp_max);

            dst->qp_init  = bak.qp_init;
            dst->qp_min_i = bak.qp_min_i;
            dst->qp_max_i = bak.qp_max_i;
            dst->qp_min   = bak.qp_min;
            dst->qp_max   = bak.qp_max;

            mpp_err("restore qp range: init %d i [%d:%d] p [%d:%d]\n",
                    dst->qp_init, dst->qp_min_i, dst->qp_max_i,
                    dst->qp_min, dst->qp_max);
        }
        if (MPP_ABS(dst->qp_delta_ip) > 8) {
            mpp_err("invalid qp delta ip %d restore to %d\n",
                    dst->qp_delta_ip, bak.qp_delta_ip);
            dst->qp_delta_ip = bak.qp_delta_ip;
        }
        if (MPP_ABS(dst->qp_delta_vi) > 6) {
            mpp_err("invalid qp delta vi %d restore to %d\n",
                    dst->qp_delta_vi, bak.qp_delta_vi);
            dst->qp_delta_vi = bak.qp_delta_vi;
        }
        if (dst->qp_max_step < 0) {
            mpp_err("invalid qp max step %d restore to %d\n",
                    dst->qp_max_step, bak.qp_max_step);
            dst->qp_max_step = bak.qp_max_step;
        }
        if (dst->stats_time && dst->stats_time > 60) {
            mpp_err("warning: bitrate statistic time %d is larger than 60s\n",
                    dst->stats_time);
        }

        dst->change |= change;

        if (ret) {
            mpp_err_f("failed to accept new rc config\n");
            *dst = bak;
        } else {
            mpp_log("MPP_ENC_SET_RC_CFG bps %d [%d : %d] fps [%d:%d] gop %d\n",
                    dst->bps_target, dst->bps_min, dst->bps_max,
                    dst->fps_in_num, dst->fps_out_num, dst->gop);
        }
    }

    return ret;
}